

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-monster.c
# Opt level: O0

_Bool mon_restrict(char *monster_type,wchar_t depth,wchar_t current_depth,_Bool unique_ok)

{
  _Bool _Var1;
  int iVar2;
  uint32_t uVar3;
  char *src;
  pit_profile *ppVar4;
  int local_3c;
  pit_profile *profile;
  int local_28;
  wchar_t j;
  wchar_t i;
  _Bool unique_ok_local;
  wchar_t current_depth_local;
  wchar_t depth_local;
  char *monster_type_local;
  
  profile._4_4_ = 0;
  allow_unique = unique_ok;
  for (local_28 = 0; local_28 < 10; local_28 = local_28 + 1) {
    base_d_char[local_28] = '\0';
  }
  select_current_level = current_depth;
  if (monster_type == (char *)0x0) {
    get_mon_num_prep((_func__Bool_monster_race_ptr *)0x0);
    monster_type_local._7_1_ = true;
  }
  else {
    iVar2 = strcmp(monster_type,"random");
    if (iVar2 == 0) {
      for (local_28 = 0; local_28 < 0x9c4; local_28 = local_28 + 1) {
        uVar3 = Rand_div(z_info->r_max - 1);
        profile._4_4_ = uVar3 + 1;
        if (r_info[profile._4_4_].rarity != L'\0') {
          if (local_28 < 200) {
            _Var1 = flag_has_dbg(r_info[profile._4_4_].flags,0xc,1,"r_info[j].flags","RF_UNIQUE");
            if (((!_Var1) && (r_info[profile._4_4_].level != L'\0')) &&
               (r_info[profile._4_4_].level <= depth)) {
              if (r_info[profile._4_4_].level - current_depth < 0) {
                local_3c = -(r_info[profile._4_4_].level - current_depth);
              }
              else {
                local_3c = r_info[profile._4_4_].level - current_depth;
              }
              if (local_3c < current_depth / 4 + 1) break;
            }
          }
          else {
            _Var1 = flag_has_dbg(r_info[profile._4_4_].flags,0xc,1,"r_info[j].flags","RF_UNIQUE");
            if (((!_Var1) && (r_info[profile._4_4_].level != L'\0')) &&
               (r_info[profile._4_4_].level <= depth)) break;
          }
        }
      }
      if (local_28 < 0x9c3) {
        src = format("%c",(ulong)(uint)(r_info[profile._4_4_].base)->d_char);
        my_strcpy(base_d_char,src,0xf);
        get_mon_num_prep(mon_select);
        monster_type_local._7_1_ = true;
      }
      else {
        monster_type_local._7_1_ = false;
      }
    }
    else {
      ppVar4 = lookup_pit_profile(monster_type);
      if (ppVar4 == (pit_profile *)0x0) {
        monster_type_local._7_1_ = false;
      }
      else {
        dun->pit_type = ppVar4;
        get_mon_num_prep(mon_pit_hook);
        monster_type_local._7_1_ = true;
      }
    }
  }
  return monster_type_local._7_1_;
}

Assistant:

bool mon_restrict(const char *monster_type, int depth, int current_depth,
		bool unique_ok)
{
	int i, j = 0;

	/* Clear global monster restriction variables. */
	allow_unique = unique_ok;
	for (i = 0; i < 10; i++)
		base_d_char[i] = '\0';
        select_current_level = current_depth;

	/* No monster type specified, no restrictions. */
	if (monster_type == NULL) {
		get_mon_num_prep(NULL);
		return true;
	} else if (streq(monster_type, "random")) {
		/* Handle random */
		for (i = 0; i < 2500; i++) {
			/* Get a random monster. */
			j = randint1(z_info->r_max - 1);

			/* Must be a real monster */
			if (!r_info[j].rarity)
				continue;

			/* Try for close to depth, accept in-depth if necessary */
			if (i < 200) {
				if ((!rf_has(r_info[j].flags, RF_UNIQUE))
					&& (r_info[j].level != 0) && (r_info[j].level <= depth)
					&& (ABS(r_info[j].level - current_depth) <
						1 + (current_depth / 4)))
					break;
			} else {
				if ((!rf_has(r_info[j].flags, RF_UNIQUE))
					&& (r_info[j].level != 0) && (r_info[j].level <= depth))
					break;
			}
		}

		/* We've found a monster. */
		if (i < 2499) {
			/* Use that monster's base type for all monsters. */
			my_strcpy(base_d_char, format("%c", r_info[j].base->d_char),
				sizeof(base_d_char));

			/* Prepare allocation table */
			get_mon_num_prep(mon_select);
			return true;
		} else
			/* Paranoia - area stays empty if no monster is found */
			return false;
	} else {
		/* Use a pit profile */
		struct pit_profile *profile = lookup_pit_profile(monster_type);

		/* Accept the profile or leave area empty if none found */
		if (profile)
			dun->pit_type = profile;
		else
			return false;

		/* Prepare allocation table */
		get_mon_num_prep(mon_pit_hook);
		return true;
	}
}